

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.hpp
# Opt level: O2

void __thiscall
czh::token::Token::Token<std::__cxx11::string>
          (Token *this,TokenType type_,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *what_,Pos *pos_)

{
  size_t sVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  this->type = type_;
  value::Value::
  Value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            (&this->what,what_);
  sVar1 = pos_->size;
  (this->pos).pos = pos_->pos;
  (this->pos).size = sVar1;
  (this->pos).code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (pos_->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (pos_->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (pos_->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->pos).code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->pos).code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var3;
  (pos_->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  return;
}

Assistant:

Token(TokenType type_, T what_, Pos pos_)
        :type(type_), what(std::move(what_)), pos(std::move(pos_)) {}